

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong *puVar8;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string file;
  int local_fc;
  string local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  FilePath local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_fc = number;
  if (number == 0) {
    pcVar2 = (base_name->pathname_)._M_dataplus._M_p;
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_98);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    paVar1 = &local_78.pathname_.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_78.pathname_.field_2._M_allocated_capacity = *psVar5;
      local_78.pathname_.field_2._8_8_ = plVar4[3];
      local_78.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.pathname_.field_2._M_allocated_capacity = *psVar5;
      local_78.pathname_._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_78.pathname_._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.pathname_._M_dataplus._M_p,
                      local_78.pathname_.field_2._M_allocated_capacity + 1);
    }
    local_c8[0] = local_88;
    puVar8 = local_98;
    if (local_98 == &local_88) goto LAB_00142b11;
  }
  else {
    pcVar2 = (base_name->pathname_)._M_dataplus._M_p;
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,pcVar2 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_d8);
    StreamableToString<int>(&local_f8,&local_fc);
    uVar6 = 0xf;
    if (local_d8 != local_c8) {
      uVar6 = local_c8[0];
    }
    if (uVar6 < local_f8._M_string_length + local_d0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        uVar7 = local_f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_f8._M_string_length + local_d0) goto LAB_00142887;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_00142887:
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    }
    local_b8 = &local_a8;
    plVar4 = puVar3 + 2;
    if ((long *)*puVar3 == plVar4) {
      local_a8 = *plVar4;
      uStack_a0 = puVar3[3];
    }
    else {
      local_a8 = *plVar4;
      local_b8 = (long *)*puVar3;
    }
    local_b0 = puVar3[1];
    *puVar3 = plVar4;
    puVar3[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_88 = *puVar8;
      lStack_80 = plVar4[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *puVar8;
      local_98 = (ulong *)*plVar4;
    }
    local_90 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    paVar1 = &local_78.pathname_.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_78.pathname_.field_2._M_allocated_capacity = *psVar5;
      local_78.pathname_.field_2._8_8_ = plVar4[3];
      local_78.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.pathname_.field_2._M_allocated_capacity = *psVar5;
      local_78.pathname_._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_78.pathname_._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.pathname_._M_dataplus._M_p,
                      local_78.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    puVar8 = local_d8;
    if (local_d8 == local_c8) goto LAB_00142b11;
  }
  operator_delete(puVar8,local_c8[0] + 1);
LAB_00142b11:
  FilePath(&local_78,&local_58);
  ConcatPaths(__return_storage_ptr__,directory,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.pathname_._M_dataplus._M_p != &local_78.pathname_.field_2) {
    operator_delete(local_78.pathname_._M_dataplus._M_p,
                    local_78.pathname_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}